

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[44],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [44],char (*Args_1) [25],
          unsigned_long *Args_2,char (*Args_3) [38],char **Args_4,char (*Args_5) [25],
          unsigned_long *Args_6,char (*Args_7) [7])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[44],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [44])this,(char (*) [25])Args,(unsigned_long *)Args_1,(char (*) [38])Args_2,
             (char **)Args_3,(char (*) [25])Args_4,(unsigned_long *)Args_5,(char (*) [7])Args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}